

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v8::detail::
       parse_precision<char,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,fmt::v8::detail::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>_>
                 *handler)

{
  char cVar1;
  char **begin_00;
  char **ppcVar2;
  specs_setter<char> *in_RDX;
  char **in_RSI;
  long in_RDI;
  int precision;
  char c;
  char c_1;
  char *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  char cVar3;
  char local_58 [8];
  int local_50;
  char local_49;
  undefined7 in_stack_ffffffffffffffd8;
  
  begin_00 = (char **)(in_RDI + 1);
  if (begin_00 == in_RSI) {
    cVar3 = '\0';
  }
  else {
    cVar3 = *(char *)begin_00;
  }
  local_49 = cVar3;
  if ((cVar3 < '0') || ('9' < cVar3)) {
    if (cVar3 != '{') {
      dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
      ::on_error((dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
                  *)CONCAT17(cVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
      return (char *)begin_00;
    }
    ppcVar2 = (char **)(in_RDI + 2);
    if (ppcVar2 != in_RSI) {
      cVar1 = *(char *)ppcVar2;
      if ((cVar1 == '}') || (cVar1 == ':')) {
        parse_precision<char,_fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>_>_&>
        ::precision_adapter::operator()
                  ((precision_adapter *)CONCAT17(0x7b,in_stack_ffffffffffffffa0));
      }
      else {
        ppcVar2 = (char **)do_parse_arg_id<char,fmt::v8::detail::parse_precision<char,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,fmt::v8::detail::error_handler>>>&>(char_const*,char_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,fmt::v8::detail::error_handler>>>&)::precision_adapter&>
                                     ((char *)in_RSI,local_58,
                                      (precision_adapter *)CONCAT17(cVar1,in_stack_ffffffffffffffd8)
                                     );
      }
    }
    begin_00 = ppcVar2;
    if ((ppcVar2 == in_RSI) || (begin_00 = (char **)((long)ppcVar2 + 1), *(char *)ppcVar2 != '}')) {
      dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
      ::on_error((dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
                  *)CONCAT17(cVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
      return (char *)begin_00;
    }
  }
  else {
    local_50 = parse_nonnegative_int<char>(begin_00,(char *)in_RSI,(int)((ulong)in_RDX >> 0x20));
    if (local_50 == -1) {
      dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
      ::on_error((dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
                  *)CONCAT17(cVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
    }
    else {
      specs_setter<char>::on_precision(in_RDX,local_50);
    }
  }
  specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>_>
  ::end_precision((specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>_>
                   *)CONCAT17(cVar3,in_stack_ffffffffffffffa0));
  return (char *)begin_00;
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}